

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O3

void __thiscall booster::locale::calendar::~calendar(calendar *this)

{
  abstract_calendar *paVar1;
  pointer pcVar2;
  
  paVar1 = (this->impl_).ptr_;
  if (paVar1 != (abstract_calendar *)0x0) {
    (*paVar1->_vptr_abstract_calendar[0xe])();
  }
  pcVar2 = (this->tz_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->tz_).field_2) {
    operator_delete(pcVar2);
  }
  std::locale::~locale(&this->locale_);
  return;
}

Assistant:

calendar::~calendar()
{
}